

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O2

void * pem_read_bio_DSAparams_d2i(void **x,uchar **inp,long len)

{
  DSA *pDVar1;
  CBS CStack_28;
  
  if (len < 0) {
    pDVar1 = (DSA *)0x0;
  }
  else {
    CStack_28.data = *inp;
    CStack_28.len = len;
    pDVar1 = DSA_parse_parameters(&CStack_28);
    if (pDVar1 != (DSA *)0x0) {
      if (x != (void **)0x0) {
        DSA_free((DSA *)*x);
        *x = pDVar1;
      }
      *inp = CStack_28.data;
    }
  }
  return pDVar1;
}

Assistant:

static EC_KEY *pkey_get_eckey(EVP_PKEY *key, EC_KEY **eckey) {
  EC_KEY *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_EC_KEY(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (eckey) {
    EC_KEY_free(*eckey);
    *eckey = dtmp;
  }
  return dtmp;
}